

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp,stbi_uc *two_back
                             )

{
  stbi_uc *psVar1;
  bool bVar2;
  bool bVar3;
  stbi_uc sVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  stbi_uc *psVar14;
  stbi_uc *psVar15;
  char *pcVar16;
  stbi_uc *psVar17;
  byte *pbVar18;
  int iVar19;
  undefined4 in_register_0000000c;
  ulong uVar20;
  uint n;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  stbi__context *unaff_R13;
  size_t __size;
  uint local_94;
  uint local_90;
  uint local_8c;
  stbi__context *local_80;
  
  psVar1 = g->out;
  if (psVar1 == (stbi_uc *)0x0) {
    iVar7 = stbi__gif_header(s,g,comp,0);
    if (iVar7 == 0) {
      return (stbi_uc *)0x0;
    }
    iVar7 = g->w;
    iVar8 = g->h;
    iVar9 = stbi__mad3sizes_valid(4,iVar7,iVar8,0);
    if (iVar9 == 0) {
      pcVar16 = "too large";
    }
    else {
      iVar8 = iVar8 * iVar7;
      __size = (size_t)(iVar8 * 4);
      unaff_R13 = (stbi__context *)malloc(__size);
      g->out = (stbi_uc *)unaff_R13;
      psVar14 = (stbi_uc *)malloc(__size);
      g->background = psVar14;
      psVar15 = (stbi_uc *)malloc((long)iVar8);
      g->history = psVar15;
      pcVar16 = "outofmem";
      if ((unaff_R13 != (stbi__context *)0x0) &&
         (psVar15 != (stbi_uc *)0x0 && psVar14 != (stbi_uc *)0x0)) {
        memset(unaff_R13,0,__size);
        memset(psVar14,0,__size);
        memset(psVar15,0,(long)iVar8);
        goto LAB_001734ad;
      }
    }
    unaff_R13 = (stbi__context *)0x0;
    stbi__g_failure_reason = pcVar16;
  }
  else {
    uVar21 = (uint)g->eflags >> 2 & 7;
    uVar6 = g->h * g->w;
    uVar13 = 2;
    if (uVar21 != 3) {
      uVar13 = uVar21;
    }
    if (CONCAT44(in_register_0000000c,req_comp) != 0) {
      uVar13 = uVar21;
    }
    if (uVar13 == 3) {
      if (0 < (int)uVar6) {
        uVar20 = 0;
        do {
          if (g->history[uVar20] != '\0') {
            *(undefined4 *)(g->out + uVar20 * 4) =
                 *(undefined4 *)(CONCAT44(in_register_0000000c,req_comp) + uVar20 * 4);
          }
          uVar20 = uVar20 + 1;
        } while (uVar6 != uVar20);
      }
    }
    else if ((uVar13 == 2) && (0 < (int)uVar6)) {
      uVar20 = 0;
      do {
        if (g->history[uVar20] != '\0') {
          *(undefined4 *)(g->out + uVar20 * 4) = *(undefined4 *)(g->background + uVar20 * 4);
        }
        uVar20 = uVar20 + 1;
      } while (uVar6 != uVar20);
    }
    memcpy(g->background,g->out,(long)g->h * (long)g->w * 4);
LAB_001734ad:
    memset(g->history,0,(long)g->h * (long)g->w);
    psVar14 = s->buffer_start;
    psVar15 = s->buffer_start + 1;
    do {
      psVar17 = s->img_buffer;
      if (psVar17 < s->img_buffer_end) {
LAB_0017354a:
        s->img_buffer = psVar17 + 1;
        sVar4 = *psVar17;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
          if (iVar7 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar14;
            s->img_buffer_end = psVar15;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar14;
            s->img_buffer_end = psVar14 + iVar7;
          }
          psVar17 = s->img_buffer;
          goto LAB_0017354a;
        }
        sVar4 = '\0';
      }
      if (sVar4 == '!') {
        psVar17 = s->img_buffer;
        if (s->img_buffer_end <= psVar17) {
          if (s->read_from_callbacks == 0) goto LAB_00173f08;
          iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
          if (iVar7 == 0) {
            s->read_from_callbacks = 0;
            s->img_buffer = psVar14;
            s->img_buffer_end = psVar15;
            s->buffer_start[0] = '\0';
          }
          else {
            s->img_buffer = psVar14;
            s->img_buffer_end = psVar14 + iVar7;
          }
          psVar17 = s->img_buffer;
        }
        s->img_buffer = psVar17 + 1;
        if (*psVar17 != 0xf9) goto LAB_00173f08;
        pbVar18 = s->img_buffer;
        if (pbVar18 < s->img_buffer_end) {
LAB_00173766:
          s->img_buffer = pbVar18 + 1;
          bVar5 = *pbVar18;
        }
        else {
          if (s->read_from_callbacks != 0) {
            iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
            if (iVar7 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar14;
              s->img_buffer_end = psVar15;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar14;
              s->img_buffer_end = psVar14 + iVar7;
            }
            pbVar18 = s->img_buffer;
            goto LAB_00173766;
          }
          bVar5 = 0;
        }
        if (bVar5 == 4) {
          pbVar18 = s->img_buffer;
          if (pbVar18 < s->img_buffer_end) {
LAB_0017390c:
            s->img_buffer = pbVar18 + 1;
            uVar13 = (uint)*pbVar18;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
              if (iVar7 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar14;
                s->img_buffer_end = psVar15;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar14;
                s->img_buffer_end = psVar14 + iVar7;
              }
              pbVar18 = s->img_buffer;
              goto LAB_0017390c;
            }
            uVar13 = 0;
          }
          g->eflags = uVar13;
          iVar7 = stbi__get16le(s);
          g->delay = iVar7 * 10;
          if (-1 < (long)g->transparent) {
            g->pal[g->transparent][3] = 0xff;
          }
          if ((g->eflags & 1) != 0) {
            pbVar18 = s->img_buffer;
            if (pbVar18 < s->img_buffer_end) {
LAB_00173ee3:
              s->img_buffer = pbVar18 + 1;
              bVar5 = *pbVar18;
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
                if (iVar7 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar14;
                  s->img_buffer_end = psVar15;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar14;
                  s->img_buffer_end = psVar14 + iVar7;
                }
                pbVar18 = s->img_buffer;
                goto LAB_00173ee3;
              }
              bVar5 = 0;
            }
            g->transparent = (uint)bVar5;
            g->pal[bVar5][3] = '\0';
            goto LAB_00173f08;
          }
          if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00173961:
            s->img_buffer = s->img_buffer + 1;
          }
          else {
            iVar7 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
            if (0 < iVar7) goto LAB_00173961;
            s->img_buffer = s->img_buffer_end;
            (*(s->io).skip)(s->io_user_data,1 - iVar7);
          }
          g->transparent = -1;
LAB_00173f08:
          do {
            pbVar18 = s->img_buffer;
            if (pbVar18 < s->img_buffer_end) {
LAB_00173f6d:
              s->img_buffer = pbVar18 + 1;
              bVar5 = *pbVar18;
            }
            else {
              if (s->read_from_callbacks != 0) {
                iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
                if (iVar7 == 0) {
                  s->read_from_callbacks = 0;
                  s->img_buffer = psVar14;
                  s->img_buffer_end = psVar15;
                  s->buffer_start[0] = '\0';
                }
                else {
                  s->img_buffer = psVar14;
                  s->img_buffer_end = psVar14 + iVar7;
                }
                pbVar18 = s->img_buffer;
                goto LAB_00173f6d;
              }
              bVar5 = 0;
            }
            if (bVar5 == 0) goto LAB_00173f82;
            stbi__skip(s,(uint)bVar5);
          } while( true );
        }
        stbi__skip(s,(uint)bVar5);
LAB_00173f82:
        bVar3 = true;
      }
      else if (sVar4 == ';') {
        bVar3 = false;
        unaff_R13 = s;
      }
      else if (sVar4 == ',') {
        iVar7 = stbi__get16le(s);
        iVar8 = stbi__get16le(s);
        iVar9 = stbi__get16le(s);
        iVar10 = stbi__get16le(s);
        if ((g->w < iVar9 + iVar7) || (g->h < iVar10 + iVar8)) {
          stbi__g_failure_reason = "bad Image Descriptor";
        }
        else {
          iVar19 = g->w * 4;
          g->line_size = iVar19;
          g->start_x = iVar7 << 2;
          g->start_y = iVar8 * iVar19;
          g->max_x = (iVar9 + iVar7) * 4;
          iVar10 = iVar19 * (iVar10 + iVar8);
          g->max_y = iVar10;
          g->cur_x = iVar7 << 2;
          if (iVar9 != 0) {
            iVar10 = iVar8 * iVar19;
          }
          g->cur_y = iVar10;
          pbVar18 = s->img_buffer;
          if (pbVar18 < s->img_buffer_end) {
LAB_001737fe:
            s->img_buffer = pbVar18 + 1;
            bVar5 = *pbVar18;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
              if (iVar7 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar14;
                s->img_buffer_end = psVar15;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar14;
                s->img_buffer_end = psVar14 + iVar7;
              }
              pbVar18 = s->img_buffer;
              goto LAB_001737fe;
            }
            bVar5 = 0;
          }
          g->lflags = (uint)bVar5;
          if ((bVar5 & 0x40) == 0) {
            g->step = g->line_size;
            g->parse = 0;
          }
          else {
            g->step = g->line_size << 3;
            g->parse = 3;
          }
          if ((char)bVar5 < '\0') {
            iVar7 = -1;
            if ((g->eflags & 1) != 0) {
              iVar7 = g->transparent;
            }
            stbi__gif_parse_colortable(s,g->lpal,2 << (bVar5 & 7),iVar7);
            g->color_table = g->lpal[0];
          }
          else {
            if ((g->flags & 0x80) == 0) {
              stbi__g_failure_reason = "missing color table";
              goto LAB_00173625;
            }
            g->color_table = g->pal[0];
          }
          pbVar18 = s->img_buffer;
          if (pbVar18 < s->img_buffer_end) {
LAB_001739fc:
            s->img_buffer = pbVar18 + 1;
            uVar13 = (uint)*pbVar18;
          }
          else {
            if (s->read_from_callbacks != 0) {
              iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
              if (iVar7 == 0) {
                s->read_from_callbacks = 0;
                s->img_buffer = psVar14;
                s->img_buffer_end = psVar15;
                s->buffer_start[0] = '\0';
              }
              else {
                s->img_buffer = psVar14;
                s->img_buffer_end = psVar14 + iVar7;
              }
              pbVar18 = s->img_buffer;
              goto LAB_001739fc;
            }
            uVar13 = 0;
          }
          if ((byte)uVar13 < 0xd) {
            uVar6 = 1 << (uVar13 & 0x1f);
            uVar20 = 0;
            do {
              g->codes[uVar20].prefix = -1;
              g->codes[uVar20].first = (stbi_uc)uVar20;
              g->codes[uVar20].suffix = (stbi_uc)uVar20;
              uVar20 = uVar20 + 1;
            } while (uVar6 != uVar20);
            uVar11 = (2 << (uVar13 & 0x1f)) - 1;
            uVar25 = 0;
            local_94 = 0xffffffff;
            bVar3 = true;
            n = 0;
            uVar21 = 0;
            local_90 = uVar6 + 2;
            local_8c = uVar11;
            uVar23 = uVar13 + 1;
LAB_00173aa4:
            do {
              if ((int)uVar23 <= (int)uVar21) {
                uVar24 = uVar25 & local_8c;
                bVar2 = true;
                if (uVar24 == uVar6) {
                  local_94 = 0xffffffff;
                  local_8c = uVar11;
                  uVar22 = uVar6 + 2;
                  uVar12 = uVar13 + 1;
LAB_00173bfd:
                  bVar3 = false;
                  uVar24 = local_94;
                  local_90 = uVar22;
                }
                else {
                  uVar12 = uVar23;
                  if (uVar24 == uVar6 + 1) {
                    do {
                      stbi__skip(s,n);
                      pbVar18 = s->img_buffer;
                      if (pbVar18 < s->img_buffer_end) {
LAB_00173c95:
                        s->img_buffer = pbVar18 + 1;
                        bVar5 = *pbVar18;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
                          if (iVar7 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar14;
                            s->img_buffer_end = psVar15;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar14;
                            s->img_buffer_end = psVar14 + iVar7;
                          }
                          pbVar18 = s->img_buffer;
                          goto LAB_00173c95;
                        }
                        bVar5 = 0;
                      }
                      if (bVar5 == 0) goto LAB_00173cd0;
                      n = (uint)bVar5;
                    } while( true );
                  }
                  if ((int)local_90 < (int)uVar24) {
                    stbi__g_failure_reason = "illegal code in raster";
                  }
                  else {
                    if (!bVar3) {
                      if ((int)local_94 < 0) {
                        if (uVar24 == local_90) {
                          stbi__g_failure_reason = "illegal code in raster";
                          bVar3 = false;
                          goto LAB_00173d0f;
                        }
                      }
                      else {
                        uVar22 = local_90 + 1;
                        if (0x1fff < (int)local_90) {
                          stbi__g_failure_reason = "too many codes";
                          bVar2 = false;
                          local_80 = (stbi__context *)0x0;
                          goto LAB_00173bfd;
                        }
                        g->codes[(int)local_90].prefix = (stbi__int16)local_94;
                        sVar4 = g->codes[local_94].first;
                        g->codes[(int)local_90].first = sVar4;
                        if (uVar24 != uVar22) {
                          sVar4 = g->codes[(int)uVar24].first;
                        }
                        g->codes[(int)local_90].suffix = sVar4;
                        local_90 = uVar22;
                      }
                      stbi__out_gif_code(g,(stbi__uint16)uVar24);
                      if ((int)local_90 < 0x1000 && (local_90 & local_8c) == 0) {
                        local_8c = ~(-1 << (uVar23 + 1 & 0x1f));
                        uVar12 = uVar23 + 1;
                      }
                      bVar3 = false;
                      bVar2 = true;
                      goto LAB_00173d18;
                    }
                    stbi__g_failure_reason = "no clear code";
                    bVar3 = true;
                  }
LAB_00173d0f:
                  bVar2 = false;
                  local_80 = (stbi__context *)0x0;
                  uVar24 = local_94;
                }
                goto LAB_00173d18;
              }
              if (n == 0) {
                pbVar18 = s->img_buffer;
                if (pbVar18 < s->img_buffer_end) {
LAB_00173b24:
                  s->img_buffer = pbVar18 + 1;
                  bVar5 = *pbVar18;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
                    if (iVar7 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar14;
                      s->img_buffer_end = psVar15;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar14;
                      s->img_buffer_end = psVar14 + iVar7;
                    }
                    pbVar18 = s->img_buffer;
                    goto LAB_00173b24;
                  }
                  bVar5 = 0;
                }
                if (bVar5 == 0) {
                  local_80 = (stbi__context *)g->out;
                  goto LAB_00173e4d;
                }
                n = (uint)bVar5;
              }
              pbVar18 = s->img_buffer;
              if (pbVar18 < s->img_buffer_end) {
LAB_00173bab:
                s->img_buffer = pbVar18 + 1;
                uVar24 = (uint)*pbVar18;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
                  if (iVar7 == 0) {
                    s->read_from_callbacks = 0;
                    s->img_buffer = psVar14;
                    s->img_buffer_end = psVar15;
                    s->buffer_start[0] = '\0';
                  }
                  else {
                    s->img_buffer = psVar14;
                    s->img_buffer_end = psVar14 + iVar7;
                  }
                  pbVar18 = s->img_buffer;
                  goto LAB_00173bab;
                }
                uVar24 = 0;
              }
              n = n - 1;
              uVar25 = uVar25 | uVar24 << (uVar21 & 0x1f);
              uVar21 = uVar21 + 8;
            } while( true );
          }
          local_80 = (stbi__context *)0x0;
LAB_00173e4d:
          if (local_80 != (stbi__context *)0x0) {
            unaff_R13 = local_80;
            if ((psVar1 == (stbi_uc *)0x0) &&
               (uVar13 = g->h * g->w, 0 < (int)uVar13 && 0 < g->bgindex)) {
              uVar20 = 0;
              do {
                if (g->history[uVar20] == '\0') {
                  g->pal[g->bgindex][3] = 0xff;
                  *(stbi_uc (*) [4])(g->out + uVar20 * 4) = g->pal[g->bgindex];
                }
                uVar20 = uVar20 + 1;
                bVar3 = false;
              } while (uVar13 != uVar20);
            }
            else {
              bVar3 = false;
            }
            goto LAB_00173f84;
          }
        }
        bVar3 = false;
        unaff_R13 = (stbi__context *)0x0;
      }
      else {
        stbi__g_failure_reason = "unknown code";
LAB_00173625:
        bVar3 = false;
        unaff_R13 = (stbi__context *)0x0;
      }
LAB_00173f84:
    } while (bVar3);
  }
  return (stbi_uc *)unaff_R13;
LAB_00173cd0:
  local_80 = (stbi__context *)g->out;
  n = 0;
  bVar2 = false;
  uVar24 = local_94;
LAB_00173d18:
  uVar25 = (int)uVar25 >> (uVar23 & 0x1f);
  uVar21 = uVar21 - uVar23;
  local_94 = uVar24;
  uVar23 = uVar12;
  if (!bVar2) goto LAB_00173e4d;
  goto LAB_00173aa4;
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp, stbi_uc *two_back)
{
   int dispose; 
   int first_frame; 
   int pi; 
   int pcount; 
   STBI_NOTUSED(req_comp);

   // on first frame, any non-written pixels get the background colour (non-transparent)
   first_frame = 0; 
   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0)) return 0; // stbi__g_failure_reason set by stbi__gif_header
      if (!stbi__mad3sizes_valid(4, g->w, g->h, 0))
         return stbi__errpuc("too large", "GIF image is too large");
      pcount = g->w * g->h;
      g->out = (stbi_uc *) stbi__malloc(4 * pcount);
      g->background = (stbi_uc *) stbi__malloc(4 * pcount);
      g->history = (stbi_uc *) stbi__malloc(pcount);
      if (!g->out || !g->background || !g->history)
         return stbi__errpuc("outofmem", "Out of memory");

      // image is treated as "transparent" at the start - ie, nothing overwrites the current background; 
      // background colour is only used for pixels that are not rendered first frame, after that "background"
      // color refers to the color that was there the previous frame. 
      memset(g->out, 0x00, 4 * pcount);
      memset(g->background, 0x00, 4 * pcount); // state of the background (starts transparent)
      memset(g->history, 0x00, pcount);        // pixels that were affected previous frame
      first_frame = 1; 
   } else {
      // second frame - how do we dispoase of the previous one?
      dispose = (g->eflags & 0x1C) >> 2; 
      pcount = g->w * g->h; 

      if ((dispose == 3) && (two_back == 0)) {
         dispose = 2; // if I don't have an image to revert back to, default to the old background
      }

      if (dispose == 3) { // use previous graphic
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &two_back[pi * 4], 4 ); 
            }
         }
      } else if (dispose == 2) { 
         // restore what was changed last frame to background before that frame; 
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &g->background[pi * 4], 4 ); 
            }
         }
      } else {
         // This is a non-disposal case eithe way, so just 
         // leave the pixels as is, and they will become the new background
         // 1: do not dispose
         // 0:  not specified.
      }

      // background is what out is after the undoing of the previou frame; 
      memcpy( g->background, g->out, 4 * g->w * g->h ); 
   }

   // clear my history; 
   memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame

   for (;;) {
      int tag = stbi__get8(s); 
      switch (tag) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            // if the width of the specified rectangle is 0, that means
            // we may not see *any* pixels or the image is malformed;
            // to make sure this is caught, move the current y down to
            // max_y (which is what out_gif_code checks).
            if (w == 0)
               g->cur_y = g->max_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");            
            
            o = stbi__process_gif_raster(s, g);
            if (!o) return NULL;

            // if this was the first frame, 
            pcount = g->w * g->h; 
            if (first_frame && (g->bgindex > 0)) {
               // if first frame, any pixel not drawn to gets the background color
               for (pi = 0; pi < pcount; ++pi) {
                  if (g->history[pi] == 0) {
                     g->pal[g->bgindex][3] = 255; // just in case it was made transparent, undo that; It will be reset next frame if need be; 
                     memcpy( &g->out[pi * 4], &g->pal[g->bgindex], 4 ); 
                  }
               }
            }

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            int ext = stbi__get8(s); 
            if (ext == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = 10 * stbi__get16le(s); // delay - 1/100th of a second, saving as 1/1000ths.

                  // unset old transparent
                  if (g->transparent >= 0) {
                     g->pal[g->transparent][3] = 255; 
                  } 
                  if (g->eflags & 0x01) {
                     g->transparent = stbi__get8(s);
                     if (g->transparent >= 0) {
                        g->pal[g->transparent][3] = 0; 
                     }
                  } else {
                     // don't need transparent
                     stbi__skip(s, 1); 
                     g->transparent = -1; 
                  }
               } else {
                  stbi__skip(s, len);
                  break;
               }
            } 
            while ((len = stbi__get8(s)) != 0) {
               stbi__skip(s, len);
            }
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}